

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool implib)

{
  pointer pcVar1;
  OutputInfo *pOVar2;
  string local_38;
  
  if (this->Target->IsImportedTarget == true) {
    cmTarget::ImportedGetFullPath(&local_38,this->Target,config,implib);
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pOVar2 = GetOutputInfo(this,config);
    if (pOVar2 == (OutputInfo *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (&pOVar2->OutDir)[implib]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,
                 pcVar1 + (&pOVar2->OutDir)[implib]._M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDirectory(const std::string& config,
                                   bool implib) const
{
  if (this->IsImported())
    {
    // Return the directory from which the target is imported.
    return
      cmSystemTools::GetFilenamePath(
      this->Target->ImportedGetFullPath(config, implib));
    }
  else if(OutputInfo const* info = this->GetOutputInfo(config))
    {
    // Return the directory in which the target will be built.
    return implib? info->ImpDir : info->OutDir;
    }
  return "";
}